

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O1

bool __thiscall
kainjow::mustache::
component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
is_newline(component<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  char cVar1;
  size_type sVar2;
  char *pcVar3;
  
  if ((this->tag).type == text) {
    sVar2 = (this->text)._M_string_length;
    if (sVar2 == 1) {
      cVar1 = *(this->text)._M_dataplus._M_p;
      return cVar1 == '\r' || cVar1 == '\n';
    }
    if (((sVar2 == 2) && (pcVar3 = (this->text)._M_dataplus._M_p, *pcVar3 == '\r')) &&
       (pcVar3[1] == '\n')) {
      return true;
    }
  }
  return false;
}

Assistant:

bool is_text() const {
        return tag.type == tag_type::text;
    }